

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O3

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::oneTaskDone(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer ptVar5;
  scheduler<concurrent_queue> *hTask;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  LOCK();
  paVar1 = &this->activeTasksCount_;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) {
    task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
    ::notifyGroupDone(&this->
                       super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                     );
    return;
  }
  if (0 < this->maxSimultaneousTasks_) {
    ptVar3 = (this->tasks_).
             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar4 = (this->tasks_).
             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      LOCK();
      paVar1 = &this->currentTaskIndex_;
      uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if ((ulong)((long)ptVar3 - (long)ptVar4 >> 4) <= uVar2) {
        return;
      }
      ptVar5 = (this->tasks_).
               super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
               super__Vector_impl_data._M_start;
      task_handle::validate(ptVar5 + uVar2);
    } while (((*(byte *)((long)ptVar5[uVar2].spTask_.
                               super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 0x21) & 1) != 0) ||
            (ptVar5 = (this->tasks_).
                      super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                      _M_impl.super__Vector_impl_data._M_start,
            task_handle::validate(ptVar5 + uVar2),
            (*(byte *)((long)ptVar5[uVar2].spTask_.
                             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 0x22) & 1) != 0));
    hTask = (this->
            super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
            ).scheduler_;
    this_00 = (this->tasks_).
              super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
              super__Vector_impl_data._M_start[uVar2].spTask_.
              super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)&stack0xffffffffffffffd0,(task_handle *)hTask);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

virtual void oneTaskDone() override final
        {
            const auto previousTaskCount = activeTasksCount_.fetch_sub(1);
            if (previousTaskCount == 1)
            {
                this->notifyGroupDone();
            }
            else if (maxSimultaneousTasks_ > 0)
            {
                const auto taskCount = tasks_.size();
                size_t i = 0;
                while ((i = currentTaskIndex_.fetch_add(1)) < taskCount)
                {
                    if (!tasks_[i].isGrabbed() && !tasks_[i].isDone())
                    {
                        this->scheduler_.add(tasks_[i]);
                        break;
                    }
                }
            }
        }